

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O2

void StatsObserver::printStats(void)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppPVar4;
  Player *pPVar5;
  GameLoop *pGVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  pointer ppPVar10;
  undefined1 auVar11 [16];
  string local_238;
  string currentPlayer;
  string percentage;
  string local_1d8;
  stringstream stream;
  
  pGVar6 = GameLoop::getInstance();
  pvVar1 = pGVar6->gameMap->pMapCountries;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar3 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  pGVar6 = GameLoop::getInstance();
  ppPVar4 = (pGVar6->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar10 = (pGVar6->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_start; ppPVar10 != ppPVar4;
      ppPVar10 = ppPVar10 + 1) {
    pPVar5 = *ppPVar10;
    if ((pPVar5->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (pPVar5->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::to_string(&percentage,*pPVar5->pPlayerId);
      std::operator+(&currentPlayer,"Player ",&percentage);
      std::__cxx11::string::~string((string *)&percentage);
      lVar8 = (long)(pPVar5->pOwnedCountries->
                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pPVar5->pOwnedCountries->
                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar9 = lVar8 >> 3;
      auVar11._8_4_ = (int)(lVar8 >> 0x23);
      auVar11._0_8_ = lVar9;
      auVar11._12_4_ = 0x45300000;
      std::__cxx11::to_string
                (&local_238,
                 (((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                 (double)(int)((ulong)((long)ppCVar3 - (long)ppCVar2) >> 3)) * 100.0);
      std::operator+(&percentage,&local_238,"%");
      std::__cxx11::string::~string((string *)&local_238);
      center(&local_238,&currentPlayer,10);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_238);
      std::operator<<(poVar7," | ");
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::to_string
                (&local_1d8,
                 (long)(pPVar5->pOwnedCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pPVar5->pOwnedCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      center(&local_238,&local_1d8,0x14);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_238);
      std::operator<<(poVar7," | ");
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1d8);
      center(&local_238,&percentage,0x14);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_238);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&percentage);
      std::__cxx11::string::~string((string *)&currentPlayer);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void StatsObserver::printStats() {
    int numberOfCountries = GameLoop::getInstance()->getGameMap()->getMapCountries()->size();
    std::stringstream stream;

    for (auto* p : *GameLoop::getInstance()->getAllPlayers()) {
        if (!p->getOwnedCountries()->empty()) {
            std::string currentPlayer = "Player " + std::to_string(p->getPlayerId());
            std::string percentage = std::to_string(
                    static_cast<double>(p->getOwnedCountries()->size()) / static_cast<double>(numberOfCountries) * 100) + "%";
            std::cout << center(currentPlayer, 10) << " | ";
            std::cout << center(std::to_string(p->getOwnedCountries()->size()), 20) << " | ";
            std::cout << center(percentage, 20) << "\n";
        }
    }
}